

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O2

_Bool target_set_interactive(wchar_t mode,wchar_t x,wchar_t y)

{
  uint32_t *puVar1;
  keycode_t *pkVar2;
  short sVar3;
  short sVar4;
  object *obj;
  chunk_conflict *pcVar5;
  byte bVar6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  char cVar10;
  uchar uVar11;
  ushort uVar12;
  int iVar13;
  wchar_t wVar14;
  object *o_1;
  loc lVar15;
  monster *pmVar16;
  object *poVar17;
  loc grid2;
  undefined7 extraout_var;
  command_conflict *pcVar18;
  loc_conflict grid1;
  keypress *pkVar19;
  wchar_t *pwVar20;
  code *pred;
  wchar_t i;
  uint uVar21;
  long lVar22;
  wchar_t wVar23;
  wchar_t wVar24;
  uint uVar25;
  player *ppVar26;
  ulong uVar27;
  ulong uVar28;
  object *o;
  wchar_t wVar29;
  bool bVar30;
  _Bool object;
  bool bVar31;
  ui_event e;
  ui_event e_00;
  ui_event e_01;
  ui_event e_02;
  ui_event e_03;
  ui_event e_04;
  ui_event e_05;
  ui_event e_06;
  ui_event e_07;
  ui_event e_08;
  ui_event e_09;
  ui_event e_10;
  ui_event e_11;
  ui_event e_12;
  ui_event e_13;
  ui_event e_14;
  ui_event e_15;
  ui_event e_16;
  ui_event e_17;
  ui_event e_18;
  ui_event e_19;
  ui_event e_20;
  ui_event e_21;
  ui_event e_22;
  keypress ch;
  keypress kc;
  undefined8 uVar32;
  _Bool *show_interesting_00;
  _Bool show_interesting;
  wchar_t local_8f4;
  wchar_t local_8f0;
  wchar_t local_8ec;
  wchar_t target_index;
  undefined4 local_8e4;
  point_set *targets;
  uint local_8d4;
  ulong local_8d0;
  wchar_t local_8c4;
  wchar_t local_8c0;
  uint local_8bc;
  object *local_8b8;
  monster *local_8b0;
  void *local_8a8;
  void *local_8a0;
  uint local_894;
  ulong local_890;
  wchar_t hgt;
  wchar_t wid;
  loc new_grid;
  undefined8 local_850;
  undefined1 local_848;
  loc path_g [256];
  
  show_interesting = true;
  local_8ec = mode;
  bVar6 = cmd_lookup_key(CMD_IGNORE,(uint)(player->opts).opt[1]);
  local_8a0 = mem_zalloc((ulong)z_info->max_range << 2);
  local_8a8 = mem_zalloc((ulong)z_info->max_range << 2);
  pcVar5 = cave;
  if (y != L'\xffffffff' && x != L'\xffffffff') {
    lVar15 = (loc)loc(x,y);
    _Var7 = square_in_bounds_fully(pcVar5,lVar15);
    if (_Var7) {
      show_interesting = false;
      local_8f4 = y;
      local_8f0 = x;
      goto LAB_001f6b55;
    }
  }
  local_8f0 = (player->grid).x;
  local_8f4 = (player->grid).y;
LAB_001f6b55:
  local_894 = (uint)bVar6;
  target_set_monster((monster *)0x0);
  disallow_animations();
  Term_get_size(&wid,&hgt);
  local_8c4 = hgt + L'\xffffffff';
  prt("Press \'?\' for help.",local_8c4,L'\0');
  targets = target_get_monsters(local_8ec,(monster_predicate)0x0,true);
  target_index = L'\0';
  local_8d0 = 0;
LAB_001f6bb7:
  do {
    bVar31 = false;
LAB_001f6bba:
    if (bVar31) {
      point_set_dispose((point_set_conflict *)targets);
      if ((local_8d0 & 1) == 0) {
        prt("",L'\0',L'\0');
        prt("",local_8c4,L'\0');
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0x3000;
      }
      else {
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0x5bfff;
        Term_clear();
      }
      verify_panel();
      handle_stuff(player);
      mem_free(local_8a8);
      mem_free(local_8a0);
      allow_animations();
      _Var7 = target_is_set();
      return _Var7;
    }
    _Var7 = true;
    bVar6 = (byte)local_8d0;
    local_8d4 = (uint)(byte)local_8d0;
    if (show_interesting == true) {
      iVar13 = point_set_size((point_set_conflict *)targets);
      _Var7 = iVar13 == 0;
      if (_Var7) {
        local_8e4 = 0;
        wVar23 = local_8f4;
      }
      else {
        local_8f0 = targets->pts[target_index].x;
        wVar23 = targets->pts[target_index].y;
        uVar32 = 0;
        adjust_panel_help(wVar23,local_8f0,(_Bool)(bVar6 & 1),player,local_8ec,(point_set **)0x0,
                          (_Bool *)0x0,(int *)0x0);
        local_8e4 = (undefined4)CONCAT71((int7)((ulong)uVar32 >> 8),1);
      }
    }
    else {
      local_8e4 = 0;
      wVar23 = local_8f4;
    }
    wVar29 = local_8f0;
    pcVar5 = cave;
    if ((local_8d0 & 1) != 0) {
      lVar15 = (loc)loc(local_8f0,wVar23);
      pmVar16 = square_monster(pcVar5,lVar15);
      _Var8 = target_able(pmVar16);
      pcVar5 = cave;
      if ((local_8ec & 1U) == 0) {
        lVar15 = (loc)loc(wVar29,wVar23);
        poVar17 = square_object(pcVar5,lVar15);
        while ((object = poVar17 != (object *)0x0, object &&
               (_Var9 = is_unknown(cave->objects[poVar17->oidx]), _Var9))) {
          poVar17 = poVar17->next;
        }
      }
      else {
        object = false;
      }
      target_display_help(_Var8,object,_Var7);
    }
    pcVar5 = cave;
    uVar12 = z_info->max_range;
    lVar15 = (loc)loc((player->grid).x,(player->grid).y);
    grid2 = (loc)loc(local_8f0,wVar23);
    local_8c0 = project_path((chunk *)pcVar5,path_g,(uint)uVar12,lVar15,grid2,L'င');
    bVar31 = false;
    local_8f4 = wVar23;
    if ((local_8ec & 1U) != 0) {
      uVar21 = local_8c0 & 0xffff;
      if (uVar21 == 0) {
        bVar31 = false;
      }
      else {
        _Var7 = panel_contains((player->grid).y,(player->grid).x);
        local_890 = (ulong)(uVar21 << 2);
        local_8bc = 0;
        for (uVar27 = 0; local_890 != uVar27; uVar27 = uVar27 + 4) {
          wVar23 = *(wchar_t *)((long)&path_g[0].x + uVar27 * 2);
          wVar29 = *(wchar_t *)((long)&path_g[0].y + uVar27 * 2);
          lVar15.y = wVar29;
          lVar15.x = wVar23;
          local_8b0 = square_monster(cave,lVar15);
          local_8b8 = square_object((chunk_conflict *)player->cave,lVar15);
          _Var8 = panel_contains(wVar29,wVar23);
          if (_Var8) {
            move_cursor_relative(wVar29,wVar23);
            pwVar20 = (wchar_t *)((long)local_8a0 + uVar27);
            Term_what(Term->scr->cx,Term->scr->cy,(int *)((long)local_8a8 + uVar27),pwVar20);
            pmVar16 = local_8b0;
            wVar23 = L'\b';
            uVar21 = (uint)CONCAT71((int7)((ulong)pwVar20 >> 8),1);
            if ((local_8bc & 1) == 0) {
              if ((local_8b0 == (monster *)0x0) || (_Var7 = monster_is_visible(local_8b0), !_Var7))
              {
                if (local_8b8 != (object *)0x0) goto LAB_001f6eee;
                _Var7 = square_isknown(cave,lVar15);
                if ((_Var7) &&
                   (_Var7 = square_isprojectable((chunk_conflict *)player->cave,lVar15), !_Var7)) {
LAB_001f6f67:
                  wVar23 = L'\x06';
                  goto LAB_001f6ef2;
                }
                _Var7 = square_isknown(cave,lVar15);
                wVar23 = L'\b';
                if (_Var7) {
                  wVar23 = L'\x01';
                }
                uVar21 = (uint)CONCAT71(extraout_var,_Var7) ^ 1;
              }
              else {
                _Var7 = monster_is_mimicking(pmVar16);
                if (_Var7) {
LAB_001f6eee:
                  wVar23 = L'\v';
                }
                else {
                  _Var7 = monster_is_camouflaged(pmVar16);
                  if (_Var7) {
                    if (local_8b8 != (object *)0x0) goto LAB_001f6eee;
                    _Var7 = square_isknown(cave,lVar15);
                    if ((_Var7) &&
                       (_Var7 = square_isprojectable((chunk_conflict *)player->cave,lVar15), !_Var7)
                       ) goto LAB_001f6f67;
                    wVar23 = L'\x01';
                  }
                  else {
                    wVar23 = L'\f';
                  }
                }
LAB_001f6ef2:
                uVar21 = 0;
              }
            }
            local_8bc = uVar21;
            Term_addch(wVar23,L'*');
          }
          else if (_Var7 != false) {
            bVar31 = uVar27 != 0;
            goto LAB_001f6f8f;
          }
          _Var7 = _Var8;
        }
        bVar31 = true;
      }
    }
LAB_001f6f8f:
    coords_desc((char *)&new_grid,L'\x14',local_8f4,local_8f0);
    iVar13 = 0;
    while (cVar10 = (*(code *)(&PTR_aux_reinit_002867a0)[iVar13])(cave,player,&new_grid),
          cVar10 == '\0') {
      bVar30 = 5 < iVar13;
      iVar13 = iVar13 + 1;
      if (bVar30) {
        iVar13 = 0;
      }
    }
    if (bVar31) {
      uVar27 = (ulong)(ushort)local_8c0;
      for (uVar28 = 0; uVar27 != uVar28; uVar28 = uVar28 + 1) {
        wVar23 = path_g[uVar28].x;
        wVar29 = path_g[uVar28].y;
        _Var7 = panel_contains(wVar29,wVar23);
        if (_Var7) {
          move_cursor_relative(wVar29,wVar23);
          Term_addch(*(wchar_t *)((long)local_8a8 + uVar28 * 4),
                     *(wchar_t *)((long)local_8a0 + uVar28 * 4));
        }
      }
      Term_fresh();
    }
    e.key.mods = local_848;
    e.mouse = (mouseclick)local_850;
    e._9_3_ = 0;
    _Var7 = event_is_mouse_m(e,'\x02','\x01');
    uVar21 = (uint)((ulong)local_850 >> 0x20);
    if ((_Var7) ||
       (e_00.key.mods = local_848, e_00.mouse = (mouseclick)local_850, e_00._9_3_ = 0,
       _Var7 = event_is_mouse(e_00,'\x03'), _Var7)) {
      pcVar5 = cave;
      wVar29 = (int)((uVar21 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) /
               (int)(uint)tile_height + Term->offset_y;
      wVar23 = (int)((uVar21 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
               Term->offset_x;
      local_8f0 = wVar23;
      local_8f4 = wVar29;
      if ((char)local_8e4 == '\0') {
        target_set_location(wVar29,wVar23);
        bVar31 = true;
        goto LAB_001f6bba;
      }
      lVar15 = (loc)loc(wVar23,wVar29);
      pmVar16 = square_monster(pcVar5,lVar15);
      _Var7 = target_able(pmVar16);
      if (_Var7) {
        target_set_monster(pmVar16);
        bVar31 = true;
        goto LAB_001f6bba;
      }
      bell();
      pcVar5 = cave;
      lVar15 = (loc)loc(wVar23,wVar29);
      _Var7 = square_in_bounds(pcVar5,lVar15);
      bVar31 = false;
      if (!_Var7) break;
      goto LAB_001f6bba;
    }
    e_01.key.mods = local_848;
    e_01.mouse = (mouseclick)local_850;
    e_01._9_3_ = 0;
    _Var7 = event_is_mouse_m(e_01,'\x02','\x04');
    if (_Var7) {
      wVar29 = (int)((uVar21 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) /
               (int)(uint)tile_height + Term->offset_y;
      wVar23 = (int)((uVar21 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
               Term->offset_x;
      cmdq_push(CMD_PATHFIND);
      pcVar18 = cmdq_peek();
      local_8f4 = wVar29;
      local_8f0 = wVar23;
      lVar15 = (loc)loc(wVar23,wVar29);
      cmd_set_arg_point(pcVar18,"point",lVar15);
      bVar31 = true;
      goto LAB_001f6bba;
    }
    e_02.key.mods = local_848;
    e_02.mouse = (mouseclick)local_850;
    e_02._9_3_ = 0;
    _Var7 = event_is_mouse(e_02,'\x02');
    if (_Var7) {
      bVar31 = true;
      if ((((local_8ec & 1U) != 0 && (char)local_8e4 == '\0') &&
          (local_8f4 ==
           (int)((uVar21 >> 8 & 0xff) - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
           Term->offset_y)) &&
         (local_8f0 ==
          (int)((uVar21 & 0xff) - col_map[Term->sidebar_mode]) / (int)(uint)tile_width +
          Term->offset_x)) {
LAB_001f72d0:
        bVar31 = true;
        target_set_location(local_8f4,local_8f0);
      }
      goto LAB_001f6bba;
    }
    e_03.key.mods = local_848;
    e_03.mouse = (mouseclick)local_850;
    e_03._9_3_ = 0;
    _Var7 = event_is_mouse(e_03,'\x01');
    if (_Var7) {
      uVar25 = uVar21 >> 8 & 0xff;
      wVar29 = (int)(uVar25 - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height +
               Term->offset_y;
      uVar21 = uVar21 & 0xff;
      wVar23 = (int)(uVar21 - col_map[Term->sidebar_mode]) / (int)(uint)tile_width + Term->offset_x;
      if (uVar25 < 2) {
        wVar29 = wVar29 + L'\xffffffff';
      }
      else if ((int)uVar25 < Term->hgt + -2) {
        if (col_map[Term->sidebar_mode] < (int)uVar21) {
          wVar23 = wVar23 + (uint)(Term->wid + -2 <= (int)uVar21);
        }
        else {
          wVar23 = wVar23 + L'\xffffffff';
        }
      }
      else {
        wVar29 = wVar29 + L'\x01';
      }
      local_8f0 = cave->width + L'\xffffffff';
      if (wVar23 < cave->width) {
        local_8f0 = wVar23;
      }
      bVar31 = false;
      if (local_8f0 < L'\x01') {
        local_8f0 = L'\0';
      }
      local_8f4 = cave->height + L'\xffffffff';
      if (wVar29 < cave->height) {
        local_8f4 = wVar29;
      }
      if (local_8f4 < L'\x01') {
        local_8f4 = L'\0';
      }
      adjust_panel_help(local_8f4,local_8f0,(_Bool)((byte)local_8d4 & 1),player,local_8ec,&targets,
                        &show_interesting,&target_index);
      goto LAB_001f6bba;
    }
    e_04.key.mods = local_848;
    e_04.mouse = (mouseclick)local_850;
    e_04._9_3_ = 0;
    _Var7 = event_is_key(e_04,0xe000);
    bVar31 = true;
    if ((_Var7) ||
       (e_05.key.mods = local_848, e_05.mouse = (mouseclick)local_850, e_05._9_3_ = 0,
       _Var7 = event_is_key(e_05,0x71), _Var7)) goto LAB_001f6bba;
    e_06.key.mods = local_848;
    e_06.mouse = (mouseclick)local_850;
    e_06._9_3_ = 0;
    _Var7 = event_is_key(e_06,0x20);
    if ((_Var7) ||
       ((e_07.key.mods = local_848, e_07.mouse = (mouseclick)local_850, e_07._9_3_ = 0,
        _Var7 = event_is_key(e_07,0x2a), _Var7 ||
        (e_08.key.mods = local_848, e_08.mouse = (mouseclick)local_850, e_08._9_3_ = 0,
        _Var7 = event_is_key(e_08,0x2b), _Var7)))) {
      bVar31 = false;
      if ((char)local_8e4 != '\0') {
        wVar29 = target_index + L'\x01';
        target_index = wVar29;
        wVar23 = point_set_size((point_set_conflict *)targets);
        bVar31 = false;
        if (wVar29 == wVar23) {
          target_index = L'\0';
          goto LAB_001f6bb7;
        }
      }
      goto LAB_001f6bba;
    }
    e_09.key.mods = local_848;
    e_09.mouse = (mouseclick)local_850;
    e_09._9_3_ = 0;
    _Var7 = event_is_key(e_09,0x2d);
    if (_Var7) {
      bVar31 = false;
      if ((char)local_8e4 != '\0') {
        bVar31 = false;
        bVar30 = target_index == L'\0';
        target_index = target_index + L'\xffffffff';
        if (bVar30) {
          iVar13 = point_set_size((point_set_conflict *)targets);
          target_index = iVar13 + L'\xffffffff';
          goto LAB_001f6bb7;
        }
      }
      goto LAB_001f6bba;
    }
    e_10.key.mods = local_848;
    e_10.mouse = (mouseclick)local_850;
    e_10._9_3_ = 0;
    _Var7 = event_is_key(e_10,0x70);
    if (_Var7) {
      local_8f0 = (player->grid).x;
      local_8f4 = (player->grid).y;
      show_interesting = false;
      verify_panel();
      handle_stuff(player);
      goto LAB_001f6bb7;
    }
    e_11.key.mods = local_848;
    e_11.mouse = (mouseclick)local_850;
    e_11._9_3_ = 0;
    _Var7 = event_is_key(e_11,0x6f);
    if (_Var7) {
      show_interesting = false;
      goto LAB_001f6bb7;
    }
    e_12.key.mods = local_848;
    e_12.mouse = (mouseclick)local_850;
    e_12._9_3_ = 0;
    _Var7 = event_is_key(e_12,0x6d);
    if (!_Var7) {
      e_13.key.mods = local_848;
      e_13.mouse = (mouseclick)local_850;
      e_13._9_3_ = 0;
      _Var7 = event_is_key(e_13,0x74);
      if ((((_Var7) ||
           (e_14.key.mods = local_848, e_14.mouse = (mouseclick)local_850, e_14._9_3_ = 0,
           _Var7 = event_is_key(e_14,0x35), _Var7)) ||
          (e_15.key.mods = local_848, e_15.mouse = (mouseclick)local_850, e_15._9_3_ = 0,
          _Var7 = event_is_key(e_15,0x30), _Var7)) ||
         (e_16.key.mods = local_848, e_16.mouse = (mouseclick)local_850, e_16._9_3_ = 0,
         _Var7 = event_is_key(e_16,0x2e), _Var7)) {
        pcVar5 = cave;
        if ((char)local_8e4 == '\0') goto LAB_001f72d0;
        lVar15 = (loc)loc(local_8f0,local_8f4);
        pmVar16 = square_monster(pcVar5,lVar15);
        _Var7 = target_able(pmVar16);
        if (_Var7) {
          target_set_monster(pmVar16);
          goto LAB_001f6bba;
        }
      }
      else {
        e_17.key.mods = local_848;
        e_17.mouse = (mouseclick)local_850;
        e_17._9_3_ = 0;
        _Var7 = event_is_key(e_17,0x67);
        if (_Var7) {
          cmdq_push(CMD_PATHFIND);
          pcVar18 = cmdq_peek();
          lVar15 = (loc)loc(local_8f0,local_8f4);
          cmd_set_arg_point(pcVar18,"point",lVar15);
          goto LAB_001f6bba;
        }
        e_18.key.mods = local_848;
        e_18.mouse = (mouseclick)local_850;
        e_18._9_3_ = 0;
        _Var7 = event_is_key(e_18,local_894);
        pcVar5 = cave;
        if (_Var7) {
          bVar31 = false;
          if ((local_8ec & 1U) == 0) {
            lVar15 = (loc)loc(local_8f0,local_8f4);
            poVar17 = square_object(pcVar5,lVar15);
            while( true ) {
              if (poVar17 == (object *)0x0) goto LAB_001f6bb7;
              obj = player->upkeep->object;
              if (obj == poVar17) break;
              poVar17 = poVar17->next;
            }
            textui_cmd_ignore_menu(obj);
            handle_stuff(player);
            point_set_dispose((point_set_conflict *)targets);
            bVar31 = false;
            targets = target_get_monsters(local_8ec,(monster_predicate)0x0,true);
          }
          goto LAB_001f6bba;
        }
        e_19.key.mods = local_848;
        e_19.mouse = (mouseclick)local_850;
        e_19._9_3_ = 0;
        _Var7 = event_is_key(e_19,0x3e);
        ppVar26 = player;
        if (_Var7) {
          lVar15 = (loc)loc(local_8f0,local_8f4);
          pred = square_isdownstairs;
LAB_001f79bc:
          wVar23 = path_nearest_known(ppVar26,lVar15,pred,&new_grid,(int16_t **)0x0);
        }
        else {
          e_20.key.mods = local_848;
          e_20.mouse = (mouseclick)local_850;
          e_20._9_3_ = 0;
          _Var7 = event_is_key(e_20,0x3c);
          ppVar26 = player;
          if (_Var7) {
            lVar15 = (loc)loc(local_8f0,local_8f4);
            pred = square_isupstairs;
            goto LAB_001f79bc;
          }
          e_21.key.mods = local_848;
          e_21.mouse = (mouseclick)local_850;
          e_21._9_3_ = 0;
          _Var7 = event_is_key(e_21,0x78);
          ppVar26 = player;
          if (!_Var7) {
            e_22.key.mods = local_848;
            e_22.mouse = (mouseclick)local_850;
            e_22._9_3_ = 0;
            _Var7 = event_is_key(e_22,0x3f);
            uVar27 = local_8d0;
            if (!_Var7) {
              ch.mods = local_848;
              ch._0_8_ = local_850;
              ch._9_3_ = 0;
              wVar23 = target_dir(ch);
              if (wVar23 == L'\0') goto LAB_001f7a10;
              if ((char)local_8e4 == '\0') {
                _Var7 = (player->opts).opt[1];
                kc.mods = local_848;
                kc._0_8_ = local_850;
                kc._9_3_ = 0;
                pkVar19 = keymap_find((uint)_Var7,kc);
                iVar13 = 1;
                if (pkVar19 == (keypress *)0x0) goto LAB_001f7a9d;
                uVar11 = cmd_lookup_key(CMD_RUN,(uint)_Var7);
                goto LAB_001f7a7b;
              }
              wVar29 = targets->pts[target_index].x;
              wVar24 = targets->pts[target_index].y;
              sVar3 = ddy[wVar23];
              sVar4 = ddx[wVar23];
              uVar12 = target_pick(wVar24,wVar29,(int)sVar3,(int)sVar4,targets);
              if ((short)uVar12 < 0) {
                local_8b0 = (monster *)CONCAT44(local_8b0._4_4_,Term->offset_x);
                local_8b8 = (object *)CONCAT44(local_8b8._4_4_,Term->offset_y);
                _Var7 = change_panel(wVar23);
                bVar31 = false;
                if (!_Var7) goto LAB_001f6bba;
                point_set_dispose((point_set_conflict *)targets);
                targets = target_get_monsters(local_8ec,(monster_predicate)0x0,true);
                uVar12 = target_pick(wVar24,wVar29,(int)sVar3,(int)sVar4,targets);
                if ((short)uVar12 < 0) {
                  _Var7 = modify_panel((term_conflict *)Term,(wchar_t)local_8b8,(wchar_t)local_8b0);
                  if (_Var7) {
                    point_set_dispose((point_set_conflict *)targets);
                    targets = target_get_monsters(local_8ec,(monster_predicate)0x0,true);
                  }
                }
                handle_stuff(player);
                bVar31 = false;
                if ((short)uVar12 < 0) goto LAB_001f6bba;
              }
              target_index = (wchar_t)uVar12;
              goto LAB_001f6bb7;
            }
            uVar28 = local_8d0 & 0xffffffff ^ 1;
            puVar1 = &player->upkeep->redraw;
            *puVar1 = *puVar1 | 0x5bfff;
            Term_clear();
            handle_stuff(player);
            bVar31 = false;
            local_8d0 = uVar28;
            if ((uVar27 & 1) != 0) {
              bVar31 = false;
              prt("Press \'?\' for help.",local_8c4,L'\0');
              local_8d0 = uVar28;
            }
            goto LAB_001f6bba;
          }
          lVar15 = (loc)loc(local_8f0,local_8f4);
          wVar23 = path_nearest_unknown(ppVar26,lVar15,&new_grid,(int16_t **)0x0);
        }
        if (L'\0' < wVar23) {
          bVar6 = (byte)local_8d4;
          pwVar20 = &target_index;
          show_interesting_00 = &show_interesting;
          local_8f4 = new_grid.y;
          local_8f0 = new_grid.x;
          goto LAB_001f7a04;
        }
      }
LAB_001f7a10:
      bell();
      goto LAB_001f6bb7;
    }
    bVar31 = false;
    if ((char)local_8e4 != '\0') goto LAB_001f6bba;
    iVar13 = point_set_size((point_set_conflict *)targets);
    wVar29 = local_8f0;
    wVar23 = local_8f4;
    bVar31 = false;
    if (iVar13 < 1) goto LAB_001f6bba;
    target_index = L'\0';
    show_interesting = true;
    wVar24 = L'ϧ';
    for (lVar22 = 0; iVar13 = point_set_size((point_set_conflict *)targets), lVar22 < iVar13;
        lVar22 = lVar22 + 1) {
      grid1 = loc(wVar29,wVar23);
      wVar14 = distance(grid1,(loc_conflict)targets->pts[lVar22]);
      if (wVar14 < wVar24) {
        target_index = (wchar_t)lVar22;
        wVar24 = wVar14;
      }
    }
  } while( true );
  local_8f0 = (player->grid).x;
  local_8f4 = (player->grid).y;
  goto LAB_001f6bb7;
  while (pkVar2 = &pkVar19->code, pkVar19 = pkVar19 + 1, uVar11 != (uchar)*pkVar2) {
LAB_001f7a7b:
    if (pkVar19->type != EVT_KBRD) {
      iVar13 = 1;
      goto LAB_001f7a9d;
    }
  }
  iVar13 = 10;
LAB_001f7a9d:
  wVar29 = ddx[wVar23] * iVar13 + local_8f0;
  wVar23 = ddy[wVar23] * iVar13 + local_8f4;
  local_8f0 = cave->width + L'\xfffffffe';
  if (wVar29 < local_8f0) {
    local_8f0 = wVar29;
  }
  if (local_8f0 < L'\x02') {
    local_8f0 = L'\x01';
  }
  local_8f4 = cave->height + L'\xfffffffe';
  if (wVar23 < local_8f4) {
    local_8f4 = wVar23;
  }
  if (local_8f4 < L'\x02') {
    local_8f4 = L'\x01';
  }
  show_interesting_00 = (_Bool *)0x0;
  pwVar20 = (wchar_t *)0x0;
  bVar6 = (byte)local_8d4;
LAB_001f7a04:
  adjust_panel_help(local_8f4,local_8f0,(_Bool)(bVar6 & 1),player,local_8ec,&targets,
                    show_interesting_00,pwVar20);
  goto LAB_001f6bb7;
}

Assistant:

bool target_set_interactive(int mode, int x, int y)
{
	int path_n;
	struct loc path_g[256];

	int wid, hgt, help_prompt_loc;

	bool done = false;
	bool show_interesting = true;
	bool help = false;
	keycode_t ignore_key = cmd_lookup_key(CMD_IGNORE,
		(OPT(player, rogue_like_commands)) ?
		KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG);

	/* These are used for displaying the path to the target */
	wchar_t *path_char = mem_zalloc(z_info->max_range * sizeof(wchar_t));
	int *path_attr = mem_zalloc(z_info->max_range * sizeof(int));

	/* If we haven't been given an initial location, start on the
	   player, otherwise  honour it by going into "free targetting" mode. */
	if (x == -1 || y == -1 || !square_in_bounds_fully(cave, loc(x, y))) {
		x = player->grid.x;
		y = player->grid.y;
	} else {
		show_interesting = false;
	}

	/* Cancel target */
	target_set_monster(0);

	/* Prevent animations */
	disallow_animations();

	/* Calculate the window location for the help prompt */
	Term_get_size(&wid, &hgt);
	help_prompt_loc = hgt - 1;
	
	/* Display the help prompt */
	prt("Press '?' for help.", help_prompt_loc, 0);

	/* Prepare the target set */
	struct point_set *targets = target_get_monsters(mode, NULL, true);
	int target_index = 0;

	/* Interact */
	while (!done) {
		bool path_drawn = false;
		bool use_interesting_mode = show_interesting && point_set_size(targets);
		bool use_free_mode = !use_interesting_mode;

		/* Use an interesting grid if requested and there are any */
		if (use_interesting_mode) {
			y = targets->pts[target_index].y;
			x = targets->pts[target_index].x;

			/* Adjust panel if needed */
			adjust_panel_help(y, x, help, player, mode, NULL,
				NULL, NULL);
		}

		/* Update help */
		if (help) {
			bool has_target = target_able(square_monster(cave, loc(x, y)));
			bool has_object = !(mode & TARGET_KILL)
					&& pile_has_known(square_object(cave, loc(x, y)));
			target_display_help(has_target, has_object, use_free_mode);
		}

		/* Find the path. */
		path_n = project_path(cave, path_g, z_info->max_range,
							  loc(player->grid.x, player->grid.y), loc(x, y),
							  PROJECT_THRU | PROJECT_INFO);

		/* Draw the path in "target" mode. If there is one */
		if (mode & (TARGET_KILL))
			path_drawn = draw_path(path_n, path_g, path_char, path_attr,
					player->grid.y, player->grid.x);

		/* Describe and Prompt */
		ui_event press = target_set_interactive_aux(y, x,
				mode | (use_free_mode ? TARGET_LOOK : 0));

		/* Remove the path */
		if (path_drawn) load_path(path_n, path_g, path_char, path_attr);

		/* Handle an input event */
		if (event_is_mouse_m(press, 2, KC_MOD_CONTROL) || event_is_mouse(press, 3)) {
			/* Set a target and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			if (use_free_mode) {
				/* Free mode: Target a location */
				target_set_location(y, x);
				done = true;
			} else {
				/* Interesting mode: Try to target a monster and done, or bell */
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
					if (!square_in_bounds(cave, loc(x, y))) {
						x = player->grid.x;
						y = player->grid.y;
					}
				}
			}

		} else if (event_is_mouse_m(press, 2, KC_MOD_ALT)) {
			/* Navigate to location and done */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_mouse(press, 2)) {
			/* Cancel and done */
			if (use_free_mode && (mode & TARGET_KILL)
					&& y == KEY_GRID_Y(press) && x == KEY_GRID_X(press)) {
				/* Free/kill mode: Clicked current location, set target */
				target_set_location(y, x);
			}
			done = true;

		} else if (event_is_mouse(press, 1)) {
			/* Relocate cursor */
			y = KEY_GRID_Y(press);
			x = KEY_GRID_X(press);

			/* If they clicked on an edge of the map, drag the cursor further
			   to trigger a panel scroll */
			if (press.mouse.y <= 1) {
				y--;
			} else if (press.mouse.y >= Term->hgt - 2) {
				y++;
			} else if (press.mouse.x <= COL_MAP) {
				x--;
			} else if (press.mouse.x >= Term->wid - 2) {
				x++;
			}

			/* Restrict cursor to inbounds */
			x = MAX(0, MIN(x, cave->width - 1));
			y = MAX(0, MIN(y, cave->height - 1));

			/*
			 * Adjust panel and target list if needed; also
			 * adjust interesting mode
			 */
			adjust_panel_help(y, x, help, player, mode, &targets,
				&show_interesting, &target_index);

		} else if (event_is_key(press, ESCAPE) || event_is_key(press, 'q')) {
			/* Cancel */
			done = true;

		} else if (event_is_key(press, ' ') || event_is_key(press, '*')
				|| event_is_key(press, '+')) {
			/* Cycle interesting target forward */
			if (use_interesting_mode && ++target_index == point_set_size(targets)) {
				target_index = 0;
			}

		} else if (event_is_key(press, '-')) {
			/* Cycle interesting target backwards */
			if (use_interesting_mode && target_index-- == 0) {
				target_index = point_set_size(targets) - 1;
			}

		} else if (event_is_key(press, 'p')) {
			/* Focus the player and switch to free mode */
			y = player->grid.y;
			x = player->grid.x;
			show_interesting = false;

			/* Recenter around player */
			verify_panel();
			handle_stuff(player);

		} else if (event_is_key(press, 'o')) {
			/* Switch to free mode */
			show_interesting = false;

		} else if (event_is_key(press, 'm')) {
			/* Switch to interesting mode */
			if (use_free_mode && point_set_size(targets) > 0) {
				show_interesting = true;
				target_index = 0;
				int min_dist = 999;

				/* Pick the nearest interesting target */
				for (int i = 0; i < point_set_size(targets); i++) {
					int dist = distance(loc(x, y), targets->pts[i]);
					if (dist < min_dist) {
						target_index = i;
						min_dist = dist;
					}
				}
			}

		} else if (event_is_key(press, 't') || event_is_key(press, '5')
				|| event_is_key(press, '0') || event_is_key(press, '.')) {
			/* Set a target and done */
			if (use_interesting_mode) {
				struct monster *m_local = square_monster(cave, loc(x, y));

				if (target_able(m_local)) {
					/* Monster race and health tracked by target_set_interactive_aux() */
					target_set_monster(m_local);
					done = true;
				} else {
					bell();
				}
			} else {
				target_set_location(y, x);
				done = true;
			}

		} else if (event_is_key(press, 'g')) {
			/* Navigate to a location and done */
			cmdq_push(CMD_PATHFIND);
			cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
			done = true;

		} else if (event_is_key(press, ignore_key)) {
			/* Ignore the tracked object, set by target_set_interactive_aux() */
			if (!(mode & TARGET_KILL)
					&& pile_is_tracked(square_object(cave, loc(x, y)))) {
				textui_cmd_ignore_menu(player->upkeep->object);
				handle_stuff(player);

				/* Recalculate interesting grids */
				point_set_dispose(targets);
				targets = target_get_monsters(mode, NULL, true);
			}

		} else if (event_is_key(press, '>')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isdownstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '<')) {
			struct loc new_grid;

			if (path_nearest_known(player, loc(x, y),
					square_isupstairs, &new_grid, NULL)
					> 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, 'x')) {
			struct loc new_grid;

			if (path_nearest_unknown(player, loc(x, y), &new_grid,
					NULL) > 0) {
				x = new_grid.x;
				y = new_grid.y;
				/*
				 * Adjust panel and target list if needed; also
				 * adjust interesting mode
				 */
				adjust_panel_help(y, x, help, player, mode,
					&targets, &show_interesting,
					&target_index);
			} else {
				bell();
			}

		} else if (event_is_key(press, '?')) {
			/* Toggle help text */
			help = !help;

			/* Redraw main window */
			player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
			Term_clear();
			handle_stuff(player);
			if (!help)
				prt("Press '?' for help.", help_prompt_loc, 0);

		} else {
			/* Try to extract a direction from the key press */
			int dir = target_dir(press.key);

			if (!dir) {
				bell();
			} else if (use_interesting_mode) {
				/* Interesting mode direction: Pick new interesting grid */
				int old_y = targets->pts[target_index].y;
				int old_x = targets->pts[target_index].x;
				int new_index;

				/* Look for a new interesting grid */
				new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

				/* If none found, try in the next panel */
				if (new_index < 0) {
					int old_wy = Term->offset_y;
					int old_wx = Term->offset_x;

					if (change_panel(dir)) {
						/* Recalculate interesting grids */
						point_set_dispose(targets);
						targets = target_get_monsters(mode, NULL, true);

						/* Look for a new interesting grid again */
						new_index = target_pick(old_y, old_x, ddy[dir], ddx[dir], targets);

						/* If none found again, reset the panel and do nothing */
						if (new_index < 0 && modify_panel(Term, old_wy, old_wx)) {
							/* Recalculate interesting grids */
							point_set_dispose(targets);
							targets = target_get_monsters(mode, NULL, true);
						}

						handle_stuff(player);
					}
				}

				/* Use interesting grid if found */
				if (new_index >= 0) target_index = new_index;
			} else {
				int step = (is_running_keymap(press.key)) ?
					10 : 1;

				/* Free mode direction: Move cursor */
				x += step * ddx[dir];
				y += step * ddy[dir];

				/* Keep 1 away from the edge */
				x = MAX(1, MIN(x, cave->width - 2));
				y = MAX(1, MIN(y, cave->height - 2));

				/* Adjust panel and target list if needed */
				adjust_panel_help(y, x, help, player, mode,
					&targets, NULL, NULL);
			}
		}
		/* End of while finally */
	}

	/* Forget */
	point_set_dispose(targets);

	/* Redraw as necessary */
	if (help) {
		player->upkeep->redraw |= (PR_BASIC | PR_EXTRA | PR_MAP | PR_EQUIP);
		Term_clear();
	} else {
		prt("", 0, 0);
		prt("", help_prompt_loc, 0);
		player->upkeep->redraw |= (PR_DEPTH | PR_STATUS);
	}

	/* Recenter around player */
	verify_panel();

	handle_stuff(player);

	mem_free(path_attr);
	mem_free(path_char);

	/* Allow animations again */
	allow_animations();

	return target_is_set();
}